

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O3

void blowfish_encrypt(uint32_t xL,uint32_t xR,uint32_t *output,BlowfishContext *ctx)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar6 = xL ^ ctx->P[0];
  uVar7 = (*(int *)((long)ctx->S1 + (ulong)(uVar6 >> 0xe & 0x3fc)) + ctx->S0[uVar6 >> 0x18] ^
          ctx->S2[uVar6 >> 8 & 0xff]) + ctx->S3[uVar6 & 0xff] ^ xR ^ ctx->P[1];
  uVar6 = (*(int *)((long)ctx->S1 + (ulong)(uVar7 >> 0xe & 0x3fc)) + ctx->S0[uVar7 >> 0x18] ^
          ctx->S2[uVar7 >> 8 & 0xff]) + ctx->S3[uVar7 & 0xff] ^ ctx->P[2] ^ uVar6;
  uVar7 = (*(int *)((long)ctx->S1 + (ulong)(uVar6 >> 0xe & 0x3fc)) + ctx->S0[uVar6 >> 0x18] ^
          ctx->S2[uVar6 >> 8 & 0xff]) + ctx->S3[uVar6 & 0xff] ^ ctx->P[3] ^ uVar7;
  uVar6 = (*(int *)((long)ctx->S1 + (ulong)(uVar7 >> 0xe & 0x3fc)) + ctx->S0[uVar7 >> 0x18] ^
          ctx->S2[uVar7 >> 8 & 0xff]) + ctx->S3[uVar7 & 0xff] ^ ctx->P[4] ^ uVar6;
  uVar7 = (*(int *)((long)ctx->S1 + (ulong)(uVar6 >> 0xe & 0x3fc)) + ctx->S0[uVar6 >> 0x18] ^
          ctx->S2[uVar6 >> 8 & 0xff]) + ctx->S3[uVar6 & 0xff] ^ ctx->P[5] ^ uVar7;
  uVar6 = (*(int *)((long)ctx->S1 + (ulong)(uVar7 >> 0xe & 0x3fc)) + ctx->S0[uVar7 >> 0x18] ^
          ctx->S2[uVar7 >> 8 & 0xff]) + ctx->S3[uVar7 & 0xff] ^ ctx->P[6] ^ uVar6;
  uVar7 = (*(int *)((long)ctx->S1 + (ulong)(uVar6 >> 0xe & 0x3fc)) + ctx->S0[uVar6 >> 0x18] ^
          ctx->S2[uVar6 >> 8 & 0xff]) + ctx->S3[uVar6 & 0xff] ^ ctx->P[7] ^ uVar7;
  uVar6 = (*(int *)((long)ctx->S1 + (ulong)(uVar7 >> 0xe & 0x3fc)) + ctx->S0[uVar7 >> 0x18] ^
          ctx->S2[uVar7 >> 8 & 0xff]) + ctx->S3[uVar7 & 0xff] ^ ctx->P[8] ^ uVar6;
  uVar7 = (*(int *)((long)ctx->S1 + (ulong)(uVar6 >> 0xe & 0x3fc)) + ctx->S0[uVar6 >> 0x18] ^
          ctx->S2[uVar6 >> 8 & 0xff]) + ctx->S3[uVar6 & 0xff] ^ ctx->P[9] ^ uVar7;
  uVar6 = (*(int *)((long)ctx->S1 + (ulong)(uVar7 >> 0xe & 0x3fc)) + ctx->S0[uVar7 >> 0x18] ^
          ctx->S2[uVar7 >> 8 & 0xff]) + ctx->S3[uVar7 & 0xff] ^ ctx->P[10] ^ uVar6;
  uVar7 = (*(int *)((long)ctx->S1 + (ulong)(uVar6 >> 0xe & 0x3fc)) + ctx->S0[uVar6 >> 0x18] ^
          ctx->S2[uVar6 >> 8 & 0xff]) + ctx->S3[uVar6 & 0xff] ^ ctx->P[0xb] ^ uVar7;
  uVar6 = (*(int *)((long)ctx->S1 + (ulong)(uVar7 >> 0xe & 0x3fc)) + ctx->S0[uVar7 >> 0x18] ^
          ctx->S2[uVar7 >> 8 & 0xff]) + ctx->S3[uVar7 & 0xff] ^ ctx->P[0xc] ^ uVar6;
  uVar7 = (*(int *)((long)ctx->S1 + (ulong)(uVar6 >> 0xe & 0x3fc)) + ctx->S0[uVar6 >> 0x18] ^
          ctx->S2[uVar6 >> 8 & 0xff]) + ctx->S3[uVar6 & 0xff] ^ ctx->P[0xd] ^ uVar7;
  uVar6 = (*(int *)((long)ctx->S1 + (ulong)(uVar7 >> 0xe & 0x3fc)) + ctx->S0[uVar7 >> 0x18] ^
          ctx->S2[uVar7 >> 8 & 0xff]) + ctx->S3[uVar7 & 0xff] ^ ctx->P[0xe] ^ uVar6;
  uVar7 = (*(int *)((long)ctx->S1 + (ulong)(uVar6 >> 0xe & 0x3fc)) + ctx->S0[uVar6 >> 0x18] ^
          ctx->S2[uVar6 >> 8 & 0xff]) + ctx->S3[uVar6 & 0xff] ^ ctx->P[0xf] ^ uVar7;
  iVar1 = *(int *)((long)ctx->S1 + (ulong)(uVar7 >> 0xe & 0x3fc));
  uVar2 = ctx->S0[uVar7 >> 0x18];
  uVar3 = ctx->S2[uVar7 >> 8 & 0xff];
  uVar4 = ctx->S3[uVar7 & 0xff];
  uVar5 = ctx->P[0x10];
  *output = uVar7 ^ ctx->P[0x11];
  output[1] = (iVar1 + uVar2 ^ uVar3) + uVar4 ^ uVar5 ^ uVar6;
  return;
}

Assistant:

static void blowfish_encrypt(uint32_t xL, uint32_t xR, uint32_t *output,
                             BlowfishContext * ctx)
{
    uint32_t *S0 = ctx->S0;
    uint32_t *S1 = ctx->S1;
    uint32_t *S2 = ctx->S2;
    uint32_t *S3 = ctx->S3;
    uint32_t *P = ctx->P;
    uint32_t t;

    ROUND(0);
    ROUND(1);
    ROUND(2);
    ROUND(3);
    ROUND(4);
    ROUND(5);
    ROUND(6);
    ROUND(7);
    ROUND(8);
    ROUND(9);
    ROUND(10);
    ROUND(11);
    ROUND(12);
    ROUND(13);
    ROUND(14);
    ROUND(15);
    xL ^= P[16];
    xR ^= P[17];

    output[0] = xR;
    output[1] = xL;
}